

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

float rsg::VariableWrite::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  IsWritableSupersetEntry filter;
  bool bVar1;
  VariableType *type;
  VariableManager *this;
  IsWritableSupersetEntry local_30;
  GeneratorState *local_18;
  GeneratorState *state_local;
  
  local_18 = state;
  type = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = rsg::anon_unknown_0::canAllocateVariable(state,type);
  if (!bVar1) {
    this = GeneratorState::getVariableManager(local_18);
    rsg::anon_unknown_0::IsWritableSupersetEntry::IsWritableSupersetEntry(&local_30,valueRange);
    filter.m_valueRange.m_min = local_30.m_valueRange.m_min;
    filter.m_valueRange.m_type = local_30.m_valueRange.m_type;
    filter.m_valueRange.m_max = local_30.m_valueRange.m_max;
    bVar1 = VariableManager::hasEntry<rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                      (this,filter);
    if (!bVar1) {
      return 0.0;
    }
  }
  return 1.0;
}

Assistant:

float VariableWrite::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsWritableSupersetEntry(valueRange)))
		return 0.0f;
	else
		return 1.0f;
}